

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O2

bool cmCMakeHostSystemInformationCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char ch;
  pointer pbVar1;
  pointer pcVar2;
  size_type sVar3;
  cmMakefile *pcVar4;
  string_view separator;
  _Alloc_hider _Var5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  _anonymous_namespace_ *p_Var10;
  _Rb_tree_node_base *p_Var11;
  const_iterator cVar12;
  size_t sVar13;
  string *psVar14;
  istream *piVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  cmValue value_00;
  ulong uVar16;
  optional<cmWindowsRegistry::View> oVar17;
  ulong uVar18;
  char *value_01;
  char *value_02;
  char *value_03;
  char *value_04;
  char *value_05;
  char *value_06;
  char *value_07;
  char *extraout_RDX;
  char *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  size_type sVar20;
  pointer pbVar21;
  string *this;
  string *name_00;
  pointer pbVar22;
  _Storage<cmWindowsRegistry::View,_true> view;
  long lVar23;
  undefined4 uVar24;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string_view name_07;
  string_view name_08;
  string_view sVar25;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_05;
  string_view str;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_17;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_18;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_19;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_20;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_21;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_22;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_23;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_24;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_25;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_26;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_27;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_28;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_29;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_30;
  string_view str_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  string_view separator_00;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  string_view prefix;
  basic_string_view<char,_std::char_traits<char>_> __y_05;
  string_view value_08;
  basic_string_view<char,_std::char_traits<char>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __y_07;
  basic_string_view<char,_std::char_traits<char>_> __y_08;
  basic_string_view<char,_std::char_traits<char>_> __y_09;
  basic_string_view<char,_std::char_traits<char>_> __y_10;
  basic_string_view<char,_std::char_traits<char>_> __y_11;
  basic_string_view<char,_std::char_traits<char>_> __y_12;
  basic_string_view<char,_std::char_traits<char>_> __y_13;
  basic_string_view<char,_std::char_traits<char>_> __y_14;
  basic_string_view<char,_std::char_traits<char>_> __y_15;
  basic_string_view<char,_std::char_traits<char>_> __y_16;
  basic_string_view<char,_std::char_traits<char>_> __y_17;
  basic_string_view<char,_std::char_traits<char>_> __y_18;
  basic_string_view<char,_std::char_traits<char>_> __y_19;
  basic_string_view<char,_std::char_traits<char>_> __y_20;
  basic_string_view<char,_std::char_traits<char>_> __y_21;
  basic_string_view<char,_std::char_traits<char>_> __y_22;
  basic_string_view<char,_std::char_traits<char>_> __y_23;
  basic_string_view<char,_std::char_traits<char>_> __y_24;
  basic_string_view<char,_std::char_traits<char>_> __y_25;
  basic_string_view<char,_std::char_traits<char>_> __y_26;
  basic_string_view<char,_std::char_traits<char>_> __y_27;
  basic_string_view<char,_std::char_traits<char>_> __y_28;
  basic_string_view<char,_std::char_traits<char>_> __y_29;
  string_view prefix_00;
  string_view key;
  string_view value_09;
  string_view key_00;
  string_view value_10;
  string_view key_01;
  string_view name_09;
  const_iterator local_470;
  cmWindowsRegistry registry;
  bool local_440;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  invalidArgs;
  string value_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scripts;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  result;
  _Any_data local_390;
  _Manager_type local_380;
  _Invoker_type p_Stack_378;
  bool local_370;
  undefined4 local_364;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  cmList variables;
  string line;
  cmArgumentParser<Arguments> parser;
  string result_list;
  static_string_view name;
  Arguments arguments;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) ||
     (__x_00._M_str = (pbVar1->_M_dataplus)._M_p, __x_00._M_len = pbVar1->_M_string_length,
     __y._M_str = "RESULT", __y._M_len = 6, bVar6 = std::operator!=(__x_00,__y), bVar6)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arguments,"missing RESULT specification.",(allocator<char> *)&parser);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((0x7f < (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) &&
       (__x_01._M_str = pbVar1[2]._M_dataplus._M_p, __x_01._M_len = pbVar1[2]._M_string_length,
       __y_00._M_str = "QUERY", __y_00._M_len = 5, bVar6 = std::operator!=(__x_01,__y_00), !bVar6))
    {
      name_00 = pbVar1 + 1;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __x_02._M_str = pbVar1[3]._M_dataplus._M_p;
      __x_02._M_len = pbVar1[3]._M_string_length;
      __y_01._M_str = "WINDOWS_REGISTRY";
      __y_01._M_len = 0x10;
      bVar6 = std::operator==(__x_02,__y_01);
      if (!bVar6) {
        if ((cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
             ::info == '\0') &&
           (iVar8 = __cxa_guard_acquire(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                         ::info), iVar8 != 0)) {
          cmsys::SystemInformation::SystemInformation(&cmCMakeHostSystemInformationCommand::info);
          __cxa_atexit(cmsys::SystemInformation::~SystemInformation,
                       &cmCMakeHostSystemInformationCommand::info,&__dso_handle);
          __cxa_guard_release(&cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::info);
        }
        if (cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
            ::initialized == '\0') {
          cmsys::SystemInformation::RunCPUCheck(&cmCMakeHostSystemInformationCommand::info);
          cmsys::SystemInformation::RunOSCheck(&cmCMakeHostSystemInformationCommand::info);
          cmsys::SystemInformation::RunMemoryCheck(&cmCMakeHostSystemInformationCommand::info);
          cmCMakeHostSystemInformationCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::initialized = '\x01';
        }
        result_list._M_dataplus._M_p = (pointer)&result_list.field_2;
        result_list._M_string_length = 0;
        result_list.field_2._M_local_buf[0] = '\0';
        uVar18 = 3;
        do {
          lVar9 = (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
          bVar6 = (ulong)(lVar9 >> 5) <= uVar18;
          local_364 = (undefined4)CONCAT71((int7)(lVar9 >> 0xd),bVar6);
          if (bVar6) {
            sVar25._M_str = result_list._M_dataplus._M_p;
            sVar25._M_len = result_list._M_string_length;
            cmMakefile::AddDefinition(status->Makefile,name_00,sVar25);
            break;
          }
          std::__cxx11::string::append((string *)&result_list);
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          __rhs = pbVar1 + uVar18;
          __x_03._M_str = pbVar1[uVar18]._M_dataplus._M_p;
          __x_03._M_len = pbVar1[uVar18]._M_string_length;
          __y_02._M_str = "NUMBER_OF_LOGICAL_CORES";
          __y_02._M_len = 0x17;
          bVar6 = std::operator==(__x_03,__y_02);
          if (bVar6) {
            uVar7 = cmsys::SystemInformation::GetNumberOfLogicalCPU
                              (&cmCMakeHostSystemInformationCommand::info);
            std::__cxx11::to_string((string *)&arguments,(ulong)uVar7);
LAB_0024fb65:
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&registry,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &arguments);
            piVar15 = (istream *)&arguments;
LAB_0024fb73:
            std::__cxx11::string::~string((string *)piVar15);
          }
          else {
            __x_04._M_str = (__rhs->_M_dataplus)._M_p;
            __x_04._M_len = __rhs->_M_string_length;
            __y_03._M_str = "NUMBER_OF_PHYSICAL_CORES";
            __y_03._M_len = 0x18;
            bVar6 = std::operator==(__x_04,__y_03);
            if (bVar6) {
              uVar7 = cmsys::SystemInformation::GetNumberOfPhysicalCPU
                                (&cmCMakeHostSystemInformationCommand::info);
              std::__cxx11::to_string((string *)&arguments,(ulong)uVar7);
              goto LAB_0024fb65;
            }
            __x_05._M_str = (__rhs->_M_dataplus)._M_p;
            __x_05._M_len = __rhs->_M_string_length;
            __y_04._M_str = "HOSTNAME";
            __y_04._M_len = 8;
            bVar6 = std::operator==(__x_05,__y_04);
            if (bVar6) {
              p_Var10 = (_anonymous_namespace_ *)
                        cmsys::SystemInformation::GetHostname
                                  (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var10,value_01)
              ;
              goto LAB_0024fb65;
            }
            __x_07._M_str = (__rhs->_M_dataplus)._M_p;
            __x_07._M_len = __rhs->_M_string_length;
            __y_06._M_str = "FQDN";
            __y_06._M_len = 4;
            bVar6 = std::operator==(__x_07,__y_06);
            if (bVar6) {
              cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_
                        ((string *)&parser,&cmCMakeHostSystemInformationCommand::info);
              piVar15 = (istream *)&parser;
              std::__cxx11::string::string((string *)&arguments,(string *)piVar15);
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&registry,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &arguments);
              std::__cxx11::string::~string((string *)&arguments);
              goto LAB_0024fb73;
            }
            __x_08._M_str = (__rhs->_M_dataplus)._M_p;
            __x_08._M_len = __rhs->_M_string_length;
            __y_07._M_str = "TOTAL_VIRTUAL_MEMORY";
            __y_07._M_len = 0x14;
            bVar6 = std::operator==(__x_08,__y_07);
            if (bVar6) {
              sVar13 = cmsys::SystemInformation::GetTotalVirtualMemory
                                 (&cmCMakeHostSystemInformationCommand::info);
              std::__cxx11::to_string((string *)&arguments,sVar13);
              goto LAB_0024fb65;
            }
            __x_09._M_str = (__rhs->_M_dataplus)._M_p;
            __x_09._M_len = __rhs->_M_string_length;
            __y_08._M_str = "AVAILABLE_VIRTUAL_MEMORY";
            __y_08._M_len = 0x18;
            bVar6 = std::operator==(__x_09,__y_08);
            if (bVar6) {
              sVar13 = cmsys::SystemInformation::GetAvailableVirtualMemory
                                 (&cmCMakeHostSystemInformationCommand::info);
              std::__cxx11::to_string((string *)&arguments,sVar13);
              goto LAB_0024fb65;
            }
            __x_10._M_str = (__rhs->_M_dataplus)._M_p;
            __x_10._M_len = __rhs->_M_string_length;
            __y_09._M_str = "TOTAL_PHYSICAL_MEMORY";
            __y_09._M_len = 0x15;
            bVar6 = std::operator==(__x_10,__y_09);
            if (bVar6) {
              sVar13 = cmsys::SystemInformation::GetTotalPhysicalMemory
                                 (&cmCMakeHostSystemInformationCommand::info);
              std::__cxx11::to_string((string *)&arguments,sVar13);
              goto LAB_0024fb65;
            }
            __x_11._M_str = (__rhs->_M_dataplus)._M_p;
            __x_11._M_len = __rhs->_M_string_length;
            __y_10._M_str = "AVAILABLE_PHYSICAL_MEMORY";
            __y_10._M_len = 0x19;
            bVar6 = std::operator==(__x_11,__y_10);
            if (bVar6) {
              sVar13 = cmsys::SystemInformation::GetAvailablePhysicalMemory
                                 (&cmCMakeHostSystemInformationCommand::info);
              std::__cxx11::to_string((string *)&arguments,sVar13);
              goto LAB_0024fb65;
            }
            __x_12._M_str = (__rhs->_M_dataplus)._M_p;
            __x_12._M_len = __rhs->_M_string_length;
            __y_11._M_str = "IS_64BIT";
            __y_11._M_len = 8;
            bVar6 = std::operator==(__x_12,__y_11);
            if (bVar6) {
              bVar6 = cmsys::SystemInformation::Is64Bits(&cmCMakeHostSystemInformationCommand::info)
              ;
              std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
              goto LAB_0024fb65;
            }
            __x_13._M_str = (__rhs->_M_dataplus)._M_p;
            __x_13._M_len = __rhs->_M_string_length;
            __y_12._M_str = "HAS_FPU";
            __y_12._M_len = 7;
            bVar6 = std::operator==(__x_13,__y_12);
            if (bVar6) {
              bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                                (&cmCMakeHostSystemInformationCommand::info,0x800000);
              std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
              goto LAB_0024fb65;
            }
            __x_14._M_str = (__rhs->_M_dataplus)._M_p;
            __x_14._M_len = __rhs->_M_string_length;
            __y_13._M_str = "HAS_MMX";
            __y_13._M_len = 7;
            bVar6 = std::operator==(__x_14,__y_13);
            if (bVar6) {
              bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                                (&cmCMakeHostSystemInformationCommand::info,1);
              std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
              goto LAB_0024fb65;
            }
            __x_15._M_str = (__rhs->_M_dataplus)._M_p;
            __x_15._M_len = __rhs->_M_string_length;
            __y_14._M_str = "HAS_MMX_PLUS";
            __y_14._M_len = 0xc;
            bVar6 = std::operator==(__x_15,__y_14);
            if (bVar6) {
              bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                                (&cmCMakeHostSystemInformationCommand::info,2);
              std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
              goto LAB_0024fb65;
            }
            __x_16._M_str = (__rhs->_M_dataplus)._M_p;
            __x_16._M_len = __rhs->_M_string_length;
            __y_15._M_str = "HAS_SSE";
            __y_15._M_len = 7;
            bVar6 = std::operator==(__x_16,__y_15);
            if (bVar6) {
              bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                                (&cmCMakeHostSystemInformationCommand::info,4);
              std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
              goto LAB_0024fb65;
            }
            __x_17._M_str = (__rhs->_M_dataplus)._M_p;
            __x_17._M_len = __rhs->_M_string_length;
            __y_16._M_str = "HAS_SSE2";
            __y_16._M_len = 8;
            bVar6 = std::operator==(__x_17,__y_16);
            if (bVar6) {
              bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                                (&cmCMakeHostSystemInformationCommand::info,8);
              std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
              goto LAB_0024fb65;
            }
            __x_18._M_str = (__rhs->_M_dataplus)._M_p;
            __x_18._M_len = __rhs->_M_string_length;
            __y_17._M_str = "HAS_SSE_FP";
            __y_17._M_len = 10;
            bVar6 = std::operator==(__x_18,__y_17);
            if (bVar6) {
              bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                                (&cmCMakeHostSystemInformationCommand::info,0x800);
              std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
              goto LAB_0024fb65;
            }
            __x_19._M_str = (__rhs->_M_dataplus)._M_p;
            __x_19._M_len = __rhs->_M_string_length;
            __y_18._M_str = "HAS_SSE_MMX";
            __y_18._M_len = 0xb;
            bVar6 = std::operator==(__x_19,__y_18);
            if (bVar6) {
              bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                                (&cmCMakeHostSystemInformationCommand::info,0x1000);
              std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
              goto LAB_0024fb65;
            }
            __x_20._M_str = (__rhs->_M_dataplus)._M_p;
            __x_20._M_len = __rhs->_M_string_length;
            __y_19._M_str = "HAS_AMD_3DNOW";
            __y_19._M_len = 0xd;
            bVar6 = std::operator==(__x_20,__y_19);
            if (bVar6) {
              bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                                (&cmCMakeHostSystemInformationCommand::info,0x10);
              std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
              goto LAB_0024fb65;
            }
            __x_21._M_str = (__rhs->_M_dataplus)._M_p;
            __x_21._M_len = __rhs->_M_string_length;
            __y_20._M_str = "HAS_AMD_3DNOW_PLUS";
            __y_20._M_len = 0x12;
            bVar6 = std::operator==(__x_21,__y_20);
            if (bVar6) {
              bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                                (&cmCMakeHostSystemInformationCommand::info,0x20);
              std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
              goto LAB_0024fb65;
            }
            __x_22._M_str = (__rhs->_M_dataplus)._M_p;
            __x_22._M_len = __rhs->_M_string_length;
            __y_21._M_str = "HAS_IA64";
            __y_21._M_len = 8;
            bVar6 = std::operator==(__x_22,__y_21);
            if (bVar6) {
              bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                                (&cmCMakeHostSystemInformationCommand::info,0x40);
              std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
              goto LAB_0024fb65;
            }
            __x_23._M_str = (__rhs->_M_dataplus)._M_p;
            __x_23._M_len = __rhs->_M_string_length;
            __y_22._M_str = "HAS_SERIAL_NUMBER";
            __y_22._M_len = 0x11;
            bVar6 = std::operator==(__x_23,__y_22);
            if (bVar6) {
              bVar6 = cmsys::SystemInformation::DoesCPUSupportFeature
                                (&cmCMakeHostSystemInformationCommand::info,0x200);
              std::__cxx11::to_string((string *)&arguments,(ulong)bVar6);
              goto LAB_0024fb65;
            }
            __x_24._M_str = (__rhs->_M_dataplus)._M_p;
            __x_24._M_len = __rhs->_M_string_length;
            __y_23._M_str = "PROCESSOR_NAME";
            __y_23._M_len = 0xe;
            bVar6 = std::operator==(__x_24,__y_23);
            if (bVar6) {
              p_Var10 = (_anonymous_namespace_ *)
                        cmsys::SystemInformation::GetExtendedProcessorName
                                  (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var10,value_02)
              ;
              goto LAB_0024fb65;
            }
            __x_25._M_str = (__rhs->_M_dataplus)._M_p;
            __x_25._M_len = __rhs->_M_string_length;
            __y_24._M_str = "PROCESSOR_DESCRIPTION";
            __y_24._M_len = 0x15;
            bVar6 = std::operator==(__x_25,__y_24);
            if (bVar6) {
              cmsys::SystemInformation::GetCPUDescription_abi_cxx11_
                        ((string *)&arguments,&cmCMakeHostSystemInformationCommand::info);
              goto LAB_0024fb65;
            }
            __x_26._M_str = (__rhs->_M_dataplus)._M_p;
            __x_26._M_len = __rhs->_M_string_length;
            __y_25._M_str = "PROCESSOR_SERIAL_NUMBER";
            __y_25._M_len = 0x17;
            bVar6 = std::operator==(__x_26,__y_25);
            if (bVar6) {
              p_Var10 = (_anonymous_namespace_ *)
                        cmsys::SystemInformation::GetProcessorSerialNumber
                                  (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var10,value_03)
              ;
              goto LAB_0024fb65;
            }
            __x_27._M_str = (__rhs->_M_dataplus)._M_p;
            __x_27._M_len = __rhs->_M_string_length;
            __y_26._M_str = "OS_NAME";
            __y_26._M_len = 7;
            bVar6 = std::operator==(__x_27,__y_26);
            if (bVar6) {
              p_Var10 = (_anonymous_namespace_ *)
                        cmsys::SystemInformation::GetOSName
                                  (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var10,value_04)
              ;
              goto LAB_0024fb65;
            }
            __x_28._M_str = (__rhs->_M_dataplus)._M_p;
            __x_28._M_len = __rhs->_M_string_length;
            __y_27._M_str = "OS_RELEASE";
            __y_27._M_len = 10;
            bVar6 = std::operator==(__x_28,__y_27);
            if (bVar6) {
              p_Var10 = (_anonymous_namespace_ *)
                        cmsys::SystemInformation::GetOSRelease
                                  (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var10,value_05)
              ;
              goto LAB_0024fb65;
            }
            __x_29._M_str = (__rhs->_M_dataplus)._M_p;
            __x_29._M_len = __rhs->_M_string_length;
            __y_28._M_str = "OS_VERSION";
            __y_28._M_len = 10;
            bVar6 = std::operator==(__x_29,__y_28);
            if (bVar6) {
              p_Var10 = (_anonymous_namespace_ *)
                        cmsys::SystemInformation::GetOSVersion
                                  (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var10,value_06)
              ;
              goto LAB_0024fb65;
            }
            __x_30._M_str = (__rhs->_M_dataplus)._M_p;
            __x_30._M_len = __rhs->_M_string_length;
            __y_29._M_str = "OS_PLATFORM";
            __y_29._M_len = 0xb;
            bVar6 = std::operator==(__x_30,__y_29);
            if (bVar6) {
              p_Var10 = (_anonymous_namespace_ *)
                        cmsys::SystemInformation::GetOSPlatform
                                  (&cmCMakeHostSystemInformationCommand::info);
              (anonymous_namespace)::ValueToString_abi_cxx11_((string *)&arguments,p_Var10,value_07)
              ;
              goto LAB_0024fb65;
            }
            local_440 = false;
          }
          if (local_440 != true) {
            str._M_str = (__rhs->_M_dataplus)._M_p;
            str._M_len = __rhs->_M_string_length;
            prefix._M_str = "DISTRIB_";
            prefix._M_len = 8;
            bVar6 = cmHasPrefix(str,prefix);
            if (!bVar6) {
              arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header
              ._M_right = (_Base_ptr)
                          ((ulong)arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                                  super__Rb_tree_header._M_header._M_right & 0xffffffffffffff00);
LAB_0024fe41:
              value.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged = false;
LAB_0024fe49:
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&arguments);
              goto LAB_0024fe51;
            }
            if (((anonymous_namespace)::
                 GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                 ::s_os_release_abi_cxx11_ != '\0') ||
               (iVar8 = __cxa_guard_acquire(&(anonymous_namespace)::
                                             GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                             ::s_os_release_abi_cxx11_), iVar8 == 0)) {
LAB_0024fbca:
              pcVar4 = status->Makefile;
              std::__cxx11::string::substr((ulong)&parser,(ulong)__rhs);
              __x_06._M_str =
                   (char *)parser.super_Base.Bindings.Keywords.
                           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                           .
                           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              __x_06._M_len =
                   (size_t)parser.super_Base.Bindings.Keywords.
                           super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                           .
                           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              __y_05._M_str = "INFO";
              __y_05._M_len = 4;
              bVar6 = std::operator==(__x_06,__y_05);
              if (bVar6) {
                result.
                super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_payload._M_value.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)((long)&result.
                                      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_payload + 0x10);
                result.
                super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_payload._M_value.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                result.
                super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_payload._M_value.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((ulong)result.
                                      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_payload._M_value.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage &
                              0xffffffffffffff00);
                for (p_Var11 = (_Rb_tree_node_base *)
                               (anonymous_namespace)::
                               GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                               ::s_os_release_abi_cxx11_._24_8_;
                    p_Var11 !=
                    (_Rb_tree_node_base *)
                    ((anonymous_namespace)::
                     GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                     ::s_os_release_abi_cxx11_ + 8);
                    p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
                  invalidArgs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)CONCAT71(invalidArgs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_7_,0x5f);
                  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                            ((string *)&arguments,name_00,(char *)&invalidArgs,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var11 + 1));
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&invalidArgs,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((anonymous_namespace)::DELIM_abi_cxx11_ +
                                    (ulong)(result.
                                            super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ._M_payload._M_value.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish !=
                                           (pointer)0x0) * 0x20),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&arguments);
                  std::__cxx11::string::append((string *)&result);
                  std::__cxx11::string::~string((string *)&invalidArgs);
                  value_08._M_str = *(char **)(p_Var11 + 2);
                  value_08._M_len = (size_t)p_Var11[2]._M_parent;
                  cmMakefile::AddDefinition(pcVar4,(string *)&arguments,value_08);
                  std::__cxx11::string::~string((string *)&arguments);
                }
                std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&arguments,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &result);
                std::__cxx11::string::~string((string *)&result);
              }
              else {
                cVar12 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(anonymous_namespace)::
                                   GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::s_os_release_abi_cxx11_,(key_type *)&parser);
                if (cVar12._M_node ==
                    (_Base_ptr)
                    ((anonymous_namespace)::
                     GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                     ::s_os_release_abi_cxx11_ + 8)) {
                  result.
                  super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_payload._M_value.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)((long)&result.
                                        super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_payload + 0x10);
                  result.
                  super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_payload._M_value.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  result.
                  super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_payload._M_value.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((ulong)result.
                                        super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_payload._M_value.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage &
                                0xffffffffffffff00);
                  std::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&arguments,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &result);
                  std::__cxx11::string::~string((string *)&result);
                }
                else {
                  std::_Optional_payload_base<std::__cxx11::string>::
                  _Optional_payload_base<std::__cxx11::string_const&>
                            ((_Optional_payload_base<std::__cxx11::string> *)&arguments,
                             cVar12._M_node + 2);
                }
              }
              std::__cxx11::string::~string((string *)&parser);
              if (((ulong)arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                          super__Rb_tree_header._M_header._M_right & 1) == 0) goto LAB_0024fe41;
              std::
              _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ::_Optional_base(&value.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ,(_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 *)&arguments);
              goto LAB_0024fe49;
            }
            pcVar4 = status->Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&arguments,"CMAKE_SYSROOT",(allocator<char> *)&parser);
            psVar14 = cmMakefile::GetSafeDefinition(pcVar4,(string *)&arguments);
            std::__cxx11::string::~string((string *)&arguments);
            (anonymous_namespace)::
            GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
            ::s_os_release_abi_cxx11_._8_4_ = 0;
            (anonymous_namespace)::
            GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
            ::s_os_release_abi_cxx11_._16_8_ = 0;
            (anonymous_namespace)::
            GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
            ::s_os_release_abi_cxx11_._24_8_ = 0x97bba0;
            (anonymous_namespace)::
            GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
            ::s_os_release_abi_cxx11_._32_8_ = 0x97bba0;
            (anonymous_namespace)::
            GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
            ::s_os_release_abi_cxx11_._40_8_ = 0;
            scripts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0xf;
            scripts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_623ecd;
            scripts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x13;
            lVar9 = 0;
LAB_0025041c:
            if (lVar9 != 0x20) {
              name.super_string_view._M_len =
                   *(size_t *)
                    ((long)&scripts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar9);
              name.super_string_view._M_str =
                   *(char **)((long)&scripts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + lVar9);
              cmStrCat<std::__cxx11::string_const&,cm::static_string_view&>
                        ((string *)&variables,psVar14,&name);
              bVar6 = cmsys::SystemTools::FileExists((string *)&variables);
              if (!bVar6) goto code_r0x0025045f;
              std::ifstream::ifstream
                        ((istream *)&arguments,
                         (char *)variables.Values.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,_S_in);
              line._M_dataplus._M_p = (pointer)&line.field_2;
              line._M_string_length = 0;
              line.field_2._M_local_buf[0] = '\0';
              while (piVar15 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                         ((istream *)&arguments,(string *)&line),
                    sVar3 = line._M_string_length, _Var5 = line._M_dataplus,
                    ((&piVar15->field_0x20)[(long)piVar15->_vptr_basic_istream[-3]] & 5) == 0) {
                invalidArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)&invalidArgs.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                invalidArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                invalidArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((ulong)invalidArgs.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage &
                              0xffffffffffffff00);
                value_1._M_dataplus._M_p = (pointer)&value_1.field_2;
                value_1._M_string_length = 0;
                value_1.field_2._M_local_buf[0] = '\0';
                for (sVar20 = 0; sVar3 != sVar20; sVar20 = sVar20 + 1) {
                  ch = _Var5._M_p[sVar20];
                  iVar8 = isalpha((int)ch);
                  if (ch == '_' || iVar8 != 0) {
                    std::__cxx11::string::push_back((char)&invalidArgs);
                  }
                  else {
                    bVar6 = cmIsSpace(ch);
                    if (!bVar6) break;
                  }
                }
                if ((invalidArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) ||
                   (value_1._M_string_length == 0)) {
                  parser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ =
                       parser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor.
                       _8_8_ & 0xffffffffffffff00;
                }
                else {
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&result,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &invalidArgs,&value_1);
                  std::
                  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::
                  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&parser,
                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&result);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&result);
                }
                std::__cxx11::string::~string((string *)&value_1);
                std::__cxx11::string::~string((string *)&invalidArgs);
                if (parser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor.
                    _M_pod_data[8] == '\x01') {
                  std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>&>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              *)(anonymous_namespace)::
                                GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                                ::s_os_release_abi_cxx11_,
                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&parser);
                }
                std::
                _Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_reset((_Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&parser);
              }
              std::__cxx11::string::~string((string *)&line);
              std::ifstream::~ifstream((istream *)&arguments);
              std::__cxx11::string::~string((string *)&variables);
            }
            if ((anonymous_namespace)::
                GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                ::s_os_release_abi_cxx11_._40_8_ != 0) goto LAB_00250d51;
            cmsys::Glob::Glob((Glob *)&arguments);
            scripts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            scripts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            scripts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            psVar14 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
            cmStrCat<std::__cxx11::string_const&,char_const(&)[36]>
                      ((string *)&parser,psVar14,
                       (char (*) [36])"/Modules/Internal/OSRelease/*.cmake");
            bVar6 = cmsys::Glob::FindFiles((Glob *)&arguments,(string *)&parser,(GlobMessages *)0x0)
            ;
            if (bVar6) {
              __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)&arguments);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=(&scripts,__x);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&result,"CMAKE_GET_OS_RELEASE_FALLBACK_SCRIPTS",
                       (allocator<char> *)&invalidArgs);
            value_00 = cmMakefile::GetDefinition(pcVar4,(string *)&result);
            cmList::append(&scripts,value_00,No);
            std::__cxx11::string::~string((string *)&result);
            pbVar1 = scripts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_470._M_current =
                 scripts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            lVar23 = (long)scripts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)scripts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            pbVar22 = scripts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            for (lVar9 = lVar23 >> 7; pbVar19 = pbVar22, 0 < lVar9; lVar9 = lVar9 + -1) {
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                      ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                    *)pbVar22,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )value_00.Value);
              if (bVar6) goto LAB_00250a1c;
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                      ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                    *)(pbVar22 + 1),
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )value_00.Value);
              pbVar19 = pbVar22 + 1;
              if (bVar6) goto LAB_00250a1c;
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                      ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                    *)(pbVar22 + 2),
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )value_00.Value);
              pbVar19 = pbVar22 + 2;
              if (bVar6) goto LAB_00250a1c;
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                      ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                    *)(pbVar22 + 3),
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )value_00.Value);
              pbVar19 = pbVar22 + 3;
              if (bVar6) goto LAB_00250a1c;
              pbVar22 = pbVar22 + 4;
              lVar23 = lVar23 + -0x80;
            }
            lVar23 = lVar23 >> 5;
            if (lVar23 == 1) {
LAB_00250a09:
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                      ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                    *)pbVar22,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )value_00.Value);
              pbVar19 = pbVar22;
              if (!bVar6) {
                pbVar19 = pbVar1;
              }
              goto LAB_00250a1c;
            }
            if (lVar23 == 2) {
LAB_002509f9:
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                      ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                    *)pbVar22,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )value_00.Value);
              pbVar19 = pbVar22;
              if (bVar6) goto LAB_00250a1c;
              pbVar22 = pbVar22 + 1;
              goto LAB_00250a09;
            }
            if (lVar23 == 3) {
              bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
                      ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                                    *)pbVar22,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )value_00.Value);
              if (bVar6) goto LAB_00250a1c;
              pbVar22 = pbVar22 + 1;
              goto LAB_002509f9;
            }
            goto LAB_00250a5a;
          }
          std::
          _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ::_Optional_base(&value.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ,(_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             *)&registry);
LAB_0024fe51:
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&registry);
          bVar6 = value.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged;
          if (value.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged == false) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &arguments,"does not recognize <key> ",__rhs);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            std::__cxx11::string::~string((string *)&arguments);
          }
          else {
            std::__cxx11::string::append((string *)&result_list);
          }
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value);
          uVar18 = uVar18 + 1;
        } while (bVar6 != false);
        std::__cxx11::string::~string((string *)&result_list);
        goto LAB_0024f6ed;
      }
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      value_1._M_string_length =
           (size_type)
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      value_1._M_dataplus._M_p = (pointer)(pbVar1 + 4);
      if (value_1._M_dataplus._M_p == (pointer)value_1._M_string_length) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&arguments,"missing <key> specification.",(allocator<char> *)&parser);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0024f6dd;
      }
      parser.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      parser.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      parser.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
      parser.super_Base.Bindings.Positions.
      super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      .
      super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
      parser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
      parser.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
      parser.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
           (void *)0x0;
      parser.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
      parser.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
           (_Manager_type)0x0;
      parser.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      parser.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
      _M_object = (void *)0x0;
      parser.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      parser.super_Base.Bindings.Keywords.
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      name_01.super_string_view._M_str = "VALUE";
      name_01.super_string_view._M_len = 5;
      cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
                  *)&parser,name_01,0x30);
      name_02.super_string_view._M_str = "VALUE_NAMES";
      name_02.super_string_view._M_len = 0xb;
      cmArgumentParser<Arguments>::Bind<bool>(&parser,name_02,0x50);
      name_03.super_string_view._M_str = "SUBKEYS";
      name_03.super_string_view._M_len = 7;
      cmArgumentParser<Arguments>::Bind<bool>(&parser,name_03,0x51);
      name_04.super_string_view._M_str = "VIEW";
      name_04.super_string_view._M_len = 4;
      cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
                  *)&parser,name_04,0x58);
      name_05.super_string_view._M_str = "SEPARATOR";
      name_05.super_string_view._M_len = 9;
      cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
                  *)&parser,name_05,0x78);
      name_06.super_string_view._M_str = "ERROR_VARIABLE";
      name_06.super_string_view._M_len = 0xe;
      cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::QueryWindowsRegistry<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>(cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,cmExecutionStatus&,std::__cxx11::string_const&)::Arguments>
                  *)&parser,name_06,0x98);
      result.
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_payload._M_value.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&invalidArgs;
      invalidArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      value_1._M_dataplus._M_p = value_1._M_dataplus._M_p + 0x20;
      arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left
           = &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header
      ;
      arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = _S_red;
      arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0
      ;
      arguments.ValueName._M_dataplus._M_p = (pointer)&arguments.ValueName.field_2;
      arguments.ValueName._M_string_length = 0;
      arguments.ValueName.field_2._M_local_buf[0] = '\0';
      arguments.ValueNames = false;
      arguments.SubKeys = false;
      arguments.View._M_dataplus._M_p = (pointer)&arguments.View.field_2;
      arguments.View._M_string_length = 0;
      arguments.View.field_2._M_local_buf[0] = '\0';
      arguments.Separator._M_dataplus._M_p = (pointer)&arguments.Separator.field_2;
      arguments.Separator._M_string_length = 0;
      invalidArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      invalidArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      arguments.Separator.field_2._M_local_buf[0] = '\0';
      arguments.ErrorVariable._M_dataplus._M_p = (pointer)&arguments.ErrorVariable.field_2;
      arguments.ErrorVariable._M_string_length = 0;
      arguments.ErrorVariable.field_2._M_local_buf[0] = '\0';
      result.
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_payload._M_value.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&arguments;
      local_390._M_unused._M_object = (void *)0x0;
      local_390._8_8_ = 0;
      local_380 = (_Manager_type)0x0;
      p_Stack_378 = (_Invoker_type)0x0;
      local_370 = false;
      result.
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_payload._M_value.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&parser;
      result.
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._24_8_ = result.
                super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_payload._M_value.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
                 _M_header._M_left;
      ArgumentParser::Instance::
      Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ((Instance *)&result,
                 (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&value_1,0);
      std::_Function_base::~_Function_base((_Function_base *)&local_390);
      if (invalidArgs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          invalidArgs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar6 = ArgumentParser::ParseResult::MaybeReportError
                          (&arguments.super_ParseResult,status->Makefile);
        uVar24 = 1;
        if (!bVar6) {
          if (arguments.ValueName._M_string_length == 0) {
            if ((arguments.ValueNames != false) && (arguments.SubKeys == true)) goto LAB_00250e42;
LAB_00250e7c:
            if ((arguments.View._M_string_length == 0) ||
               (name_07._M_str = extraout_RDX,
               name_07._M_len = (size_t)arguments.View._M_dataplus._M_p,
               oVar17 = cmWindowsRegistry::ToView
                                  ((cmWindowsRegistry *)arguments.View._M_string_length,name_07),
               ((ulong)oVar17.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
                       super__Optional_payload_base<cmWindowsRegistry::View> >> 0x20 & 1) != 0)) {
              pcVar4 = status->Makefile;
              view._M_value = Both;
              cmMakefile::AddDefinition(pcVar4,name_00,(string_view)(ZEXT816(0x70a819) << 0x40));
              if (arguments.View._M_string_length != 0) {
                name_08._M_str = extraout_RDX_00;
                name_08._M_len = (size_t)arguments.View._M_dataplus._M_p;
                oVar17 = cmWindowsRegistry::ToView
                                   ((cmWindowsRegistry *)arguments.View._M_string_length,name_08);
                view._M_value =
                     oVar17.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
                     super__Optional_payload_base<cmWindowsRegistry::View>._M_payload;
              }
              cmWindowsRegistry::cmWindowsRegistry(&registry,pcVar4,&cmWindowsRegistry::AllTypes);
              if (arguments.ValueNames == true) {
                key._M_str = pbVar1[4]._M_dataplus._M_p;
                key._M_len = pbVar1[4]._M_string_length;
                cmWindowsRegistry::GetValueNames_abi_cxx11_(&result,&registry,key,view._M_value);
                if (result.
                    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_engaged == true) {
                  cmList::
                  to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                            ((string *)&value,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&result);
                  value_09._M_str =
                       (char *)value.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload._M_value._M_dataplus._M_p;
                  value_09._M_len =
                       value.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload._M_value._M_string_length;
                  cmMakefile::AddDefinition(pcVar4,name_00,value_09);
LAB_00250ffb:
                  std::__cxx11::string::~string((string *)&value);
                }
LAB_00251008:
                std::
                _Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::_M_reset((_Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&result);
              }
              else {
                if (arguments.SubKeys == true) {
                  key_00._M_str = pbVar1[4]._M_dataplus._M_p;
                  key_00._M_len = pbVar1[4]._M_string_length;
                  cmWindowsRegistry::GetSubKeys_abi_cxx11_(&result,&registry,key_00,view._M_value);
                  if (result.
                      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_engaged == true) {
                    cmList::
                    to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                              ((string *)&value,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&result);
                    value_10._M_str =
                         (char *)value.
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_payload._M_value._M_dataplus._M_p;
                    value_10._M_len =
                         value.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._M_value._M_string_length;
                    cmMakefile::AddDefinition(pcVar4,name_00,value_10);
                    goto LAB_00250ffb;
                  }
                  goto LAB_00251008;
                }
                scripts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)arguments.Separator._M_string_length;
                scripts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)arguments.Separator._M_dataplus._M_p;
                separator._M_str = arguments.Separator._M_dataplus._M_p;
                separator._M_len = arguments.Separator._M_string_length;
                key_01._M_str = pbVar1[4]._M_dataplus._M_p;
                key_01._M_len = pbVar1[4]._M_string_length;
                name_09._M_str = arguments.ValueName._M_dataplus._M_p;
                name_09._M_len = arguments.ValueName._M_string_length;
                cmWindowsRegistry::ReadValue_abi_cxx11_
                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&result,&registry,key_01,name_09,view._M_value,separator);
                std::
                _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&result);
              }
              if (arguments.ErrorVariable._M_string_length != 0) {
                sVar25 = cmWindowsRegistry::GetLastError(&registry);
                cmMakefile::AddDefinition(pcVar4,&arguments.ErrorVariable,sVar25);
              }
              std::__cxx11::string::~string((string *)&registry);
              goto LAB_0024f9c0;
            }
            registry.LastError._M_dataplus._M_p._0_1_ = 0x2e;
            cmStrCat<char_const(&)[33],std::__cxx11::string_const&,char>
                      ((string *)&result,(char (*) [33])"given invalid value for \"VIEW\": ",
                       &arguments.View,(char *)&registry);
            std::__cxx11::string::_M_assign((string *)&status->Error);
          }
          else {
            if ((arguments.ValueNames == false) && (arguments.SubKeys == false)) goto LAB_00250e7c;
LAB_00250e42:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&result,
                       "given mutually exclusive sub-options \"VALUE\", \"VALUE_NAMES\" or \"SUBKEYS\"."
                       ,(allocator<char> *)&registry);
            std::__cxx11::string::_M_assign((string *)&status->Error);
          }
          this = (string *)&result;
          goto LAB_0024f9b8;
        }
      }
      else {
        separator_00._M_str = ", ";
        separator_00._M_len = 2;
        cmJoin(&registry.LastError,&invalidArgs,separator_00,(string_view)ZEXT816(0));
        cmStrCat<char_const(&)[28],std::__cxx11::string,char_const(&)[3]>
                  ((string *)&result,(char (*) [28])"given invalid argument(s) \"",
                   &registry.LastError,(char (*) [3])0x6e2148);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)&result);
        this = (string *)&registry;
LAB_0024f9b8:
        std::__cxx11::string::~string(this);
        uVar24 = 0;
      }
LAB_0024f9c0:
      anon_unknown.dwarf_61099c::anon_func::Arguments::~Arguments(&arguments);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&invalidArgs);
      ArgumentParser::ActionMap::~ActionMap((ActionMap *)&parser);
      local_364 = uVar24;
      goto LAB_0024f6ed;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arguments,"missing QUERY specification",(allocator<char> *)&parser);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
LAB_0024f6dd:
  std::__cxx11::string::~string((string *)&arguments);
  local_364 = 0;
LAB_0024f6ed:
  return SUB41(local_364,0);
code_r0x0025045f:
  std::__cxx11::string::~string((string *)&variables);
  lVar9 = lVar9 + 0x10;
  goto LAB_0025041c;
LAB_00250a1c:
  local_470._M_current = pbVar19;
  if (pbVar19 != pbVar1) {
    while (pbVar19 = pbVar19 + 1, pbVar19 != pbVar1) {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::GetOSReleaseVariables[abi:cxx11](cmExecutionStatus&)::__0>
                            *)pbVar19,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )value_00.Value);
      if (!bVar6) {
        value_00.Value = pbVar19;
        std::__cxx11::string::operator=((string *)local_470._M_current,(string *)pbVar19);
        local_470._M_current = local_470._M_current + 1;
      }
    }
  }
LAB_00250a5a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&scripts,local_470,
          (const_iterator)
          scripts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  pbVar22 = scripts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = scripts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (scripts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      scripts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar23 = (long)scripts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)scripts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = lVar23 >> 5;
    lVar9 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__1>>
              (scripts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               scripts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar23 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__1>>
                (pbVar1,pbVar22);
    }
    else {
      pbVar21 = pbVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__1>>
                (pbVar1,pbVar21);
      for (; pbVar21 != pbVar22; pbVar21 = pbVar21 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__1>>
                  (pbVar21);
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"CMAKE_GET_OS_RELEASE_FALLBACK_RESULT",
             (allocator<char> *)&invalidArgs);
  pbVar1 = scripts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (local_470._M_current =
            scripts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start; local_470._M_current != pbVar1;
      local_470._M_current = local_470._M_current + 1) {
    cmMakefile::RemoveDefinition(pcVar4,(string *)&result);
    bVar6 = cmMakefile::ReadListFile(pcVar4,local_470._M_current);
    if ((bVar6) && (bVar6 = cmSystemTools::GetErrorOccurredFlag(), !bVar6)) {
      psVar14 = (string *)cmMakefile::GetDefinition(pcVar4,(string *)&result);
      if (psVar14 == (string *)0x0) {
        psVar14 = &cmValue::Empty_abi_cxx11_;
      }
      std::__cxx11::string::string((string *)&invalidArgs,(string *)psVar14);
      init._M_len = 1;
      init._M_array = (iterator)&invalidArgs;
      cmList::cmList(&variables,init);
      std::__cxx11::string::~string((string *)&invalidArgs);
      pbVar22 = variables.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar21 = variables.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (variables.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          variables.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        for (; pbVar21 != pbVar22; pbVar21 = pbVar21 + 1) {
          psVar14 = cmMakefile::GetSafeDefinition(pcVar4,pbVar21);
          std::__cxx11::string::string((string *)&invalidArgs,(string *)psVar14);
          cmMakefile::RemoveDefinition(pcVar4,pbVar21);
          pcVar2 = (pbVar21->_M_dataplus)._M_p;
          sVar3 = pbVar21->_M_string_length;
          line._M_dataplus._M_p._0_1_ = 0x5f;
          cmStrCat<std::__cxx11::string_const&,char>
                    (&value_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &result,(char *)&line);
          str_00._M_str = pcVar2;
          str_00._M_len = sVar3;
          prefix_00._M_str = value_1._M_dataplus._M_p;
          prefix_00._M_len = value_1._M_string_length;
          bVar6 = cmHasPrefix(str_00,prefix_00);
          std::__cxx11::string::~string((string *)&value_1);
          if (bVar6) {
            std::__cxx11::string::substr((ulong)&value_1,(ulong)pbVar21);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)(anonymous_namespace)::
                          GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                          ::s_os_release_abi_cxx11_,&value_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &invalidArgs);
            std::__cxx11::string::~string((string *)&value_1);
          }
          std::__cxx11::string::~string((string *)&invalidArgs);
        }
        if ((anonymous_namespace)::
            GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
            ::s_os_release_abi_cxx11_._40_8_ != 0) {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[21],std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)(anonymous_namespace)::
                        GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                        ::s_os_release_abi_cxx11_,(char (*) [21])"USED_FALLBACK_SCRIPT",
                     local_470._M_current);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&variables.Values);
          break;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&variables.Values);
    }
  }
  cmMakefile::RemoveDefinition(pcVar4,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&parser);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&scripts);
  cmsys::Glob::~Glob((Glob *)&arguments);
LAB_00250d51:
  __cxa_atexit(std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::~map,(anonymous_namespace)::
                      GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                      ::s_os_release_abi_cxx11_,&__dso_handle);
  __cxa_guard_release(&(anonymous_namespace)::
                       GetDistribValue(cmExecutionStatus&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                       ::s_os_release_abi_cxx11_);
  goto LAB_0024fbca;
}

Assistant:

bool cmCMakeHostSystemInformationCommand(std::vector<std::string> const& args,
                                         cmExecutionStatus& status)
{
  std::size_t current_index = 0;

  if (args.size() < (current_index + 2) || args[current_index] != "RESULT"_s) {
    status.SetError("missing RESULT specification.");
    return false;
  }

  auto const& variable = args[current_index + 1];
  current_index += 2;

  if (args.size() < (current_index + 2) || args[current_index] != "QUERY"_s) {
    status.SetError("missing QUERY specification");
    return false;
  }

  if (args[current_index + 1] == "WINDOWS_REGISTRY"_s) {
    return QueryWindowsRegistry(cmMakeRange(args).advance(current_index + 2),
                                status, variable);
  }

  static cmsys::SystemInformation info;
  static auto initialized = false;
  if (!initialized) {
    info.RunCPUCheck();
    info.RunOSCheck();
    info.RunMemoryCheck();
    initialized = true;
  }

  std::string result_list;
  for (auto i = current_index + 1; i < args.size(); ++i) {
    result_list += DELIM[!result_list.empty()];

    auto const& key = args[i];
    // clang-format off
    auto value =
      GetValueChained(
          [&]() { return GetValue(info, key); }
        , [&]() { return GetDistribValue(status, key, variable); }
#ifdef _WIN32
        , [&]() { return GetWindowsValue(status, key); }
#endif
        );
    // clang-format on
    if (!value) {
      status.SetError("does not recognize <key> " + key);
      return false;
    }
    result_list += value.value();
  }

  status.GetMakefile().AddDefinition(variable, result_list);

  return true;
}